

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedSSOAtomicCounters::Run(AdvancedSSOAtomicCounters *this)

{
  float *this_00;
  bool bVar1;
  GLuint GVar2;
  int w;
  int h;
  reference pvVar3;
  CallLogWrapper *this_01;
  Vector<float,_4> local_140;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  Vector<float,_4> local_110;
  Vector<float,_4> local_100;
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  Vector<float,_4> local_d0;
  int local_c0;
  allocator<tcu::Vector<float,_4>_> local_b9;
  int i;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  float local_7c;
  undefined1 local_78 [8];
  mat4 identity;
  vec4 zero;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedSSOAtomicCounters *this_local;
  
  bVar1 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,1);
  if (bVar1) {
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
    GVar2 = ShaderImageLoadStoreBase::BuildShaderProgram
                      (&this->super_ShaderImageLoadStoreBase,0x8b31,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(location = 1) in vec4 i_color;\nlayout(location = 3) out vec4 o_color;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nlayout(std140) uniform Transform {\n  mat4 mvp;\n} g_transform;\nwriteonly uniform imageBuffer g_buffer;\nlayout(binding = 0, offset = 0) uniform atomic_uint g_counter;\nvoid main() {\n  gl_Position = g_transform.mvp * i_position;\n  o_color = i_color;\n  const uint index = atomicCounterIncrement(g_counter);\n  imageStore(g_buffer, int(index), gl_Position);\n}"
                      );
    this->m_vsp = GVar2;
    GVar2 = ShaderImageLoadStoreBase::BuildShaderProgram
                      (&this->super_ShaderImageLoadStoreBase,0x8b30,
                       "#version 420 core\nlayout(location = 3) in vec4 i_color;\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = i_color;\n}"
                      );
    this->m_fsp = GVar2;
    this_01 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgramStages(this_01,this->m_pipeline,1,this->m_vsp);
    glu::CallLogWrapper::glUseProgramStages(this_01,this->m_pipeline,2,this->m_fsp);
    glu::CallLogWrapper::glBindBuffer(this_01,0x8c2a,this->m_buffer);
    glu::CallLogWrapper::glBufferData(this_01,0x8c2a,0x40,(void *)0x0,0x88e4);
    glu::CallLogWrapper::glBindTexture(this_01,0x8c2a,this->m_buffer_tex);
    glu::CallLogWrapper::glTexBuffer(this_01,0x8c2a,0x8814,this->m_buffer);
    glu::CallLogWrapper::glBindBuffer(this_01,0x92c0,this->m_counter_buffer);
    this_00 = identity.m_data.m_data[3].m_data + 2;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this_00,0.0);
    glu::CallLogWrapper::glBufferData(this_01,0x92c0,4,this_00,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_01,0x8a11,this->m_transform_buffer);
    local_7c = 1.0;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)local_78,&local_7c);
    glu::CallLogWrapper::glBufferData(this_01,0x8a11,0x40,(Matrix<float,_4,_4> *)local_78,0x88e4);
    glu::CallLogWrapper::glClear
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x92c0,0,this->m_counter_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8a11,0,this->m_transform_buffer);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,this->m_buffer_tex,0,'\0',0,0x88ba,0x8814);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vao);
    glu::CallLogWrapper::glBindProgramPipeline
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_pipeline);
    glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,0,4,1,0);
    w = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
    h = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)
               ((long)&data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0.0,1.0,0.0,1.0);
    bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&this->super_ShaderImageLoadStoreBase,0,0,w,h,
                       (vec4 *)((long)&data.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<tcu::Vector<float,_4>_>::allocator(&local_b9);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i,4,
                 &local_b9);
      std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_b9);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c2a,this->m_buffer);
      pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &i,0);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c2a,0,0x40,pvVar3);
      for (local_c0 = 0; local_c0 < 4; local_c0 = local_c0 + 1) {
        pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)&i,(long)local_c0);
        tcu::Vector<float,_4>::Vector(&local_d0,pvVar3);
        tcu::Vector<float,_4>::Vector(&local_e0,-1.0,-1.0,0.0,1.0);
        bVar1 = ShaderImageLoadStoreBase::IsEqual
                          (&this->super_ShaderImageLoadStoreBase,&local_d0,&local_e0);
        if (!bVar1) {
          pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                   operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               *)&i,(long)local_c0);
          tcu::Vector<float,_4>::Vector(&local_f0,pvVar3);
          tcu::Vector<float,_4>::Vector(&local_100,1.0,-1.0,0.0,1.0);
          bVar1 = ShaderImageLoadStoreBase::IsEqual
                            (&this->super_ShaderImageLoadStoreBase,&local_f0,&local_100);
          if (!bVar1) {
            pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                     operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 *)&i,(long)local_c0);
            tcu::Vector<float,_4>::Vector(&local_110,pvVar3);
            tcu::Vector<float,_4>::Vector(&local_120,-1.0,1.0,0.0,1.0);
            bVar1 = ShaderImageLoadStoreBase::IsEqual
                              (&this->super_ShaderImageLoadStoreBase,&local_110,&local_120);
            if (!bVar1) {
              pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                       operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   *)&i,(long)local_c0);
              tcu::Vector<float,_4>::Vector(&local_130,pvVar3);
              tcu::Vector<float,_4>::Vector(&local_140,1.0,1.0,0.0,1.0);
              bVar1 = ShaderImageLoadStoreBase::IsEqual
                                (&this->super_ShaderImageLoadStoreBase,&local_130,&local_140);
              if (!bVar1) {
                this_local = (AdvancedSSOAtomicCounters *)&DAT_ffffffffffffffff;
                goto LAB_01092fa3;
              }
            }
          }
        }
      }
      this_local = (AdvancedSSOAtomicCounters *)0x0;
LAB_01092fa3:
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&i);
    }
    else {
      this_local = (AdvancedSSOAtomicCounters *)&DAT_ffffffffffffffff;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_78);
  }
  else {
    this_local = (AdvancedSSOAtomicCounters *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);
		const char* const glsl_vs =
			"#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
			"layout(location = 1) in vec4 i_color;" NL "layout(location = 3) out vec4 o_color;" NL
			"out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL "layout(std140) uniform Transform {" NL
			"  mat4 mvp;" NL "} g_transform;" NL "writeonly uniform imageBuffer g_buffer;" NL
			"layout(binding = 0, offset = 0) uniform atomic_uint g_counter;" NL "void main() {" NL
			"  gl_Position = g_transform.mvp * i_position;" NL "  o_color = i_color;" NL
			"  const uint index = atomicCounterIncrement(g_counter);" NL
			"  imageStore(g_buffer, int(index), gl_Position);" NL "}";
		const char* const glsl_fs =
			"#version 420 core" NL "layout(location = 3) in vec4 i_color;" NL
			"layout(location = 0) out vec4 o_color;" NL "void main() {" NL "  o_color = i_color;" NL "}";
		m_vsp = BuildShaderProgram(GL_VERTEX_SHADER, glsl_vs);
		m_fsp = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs);

		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);

		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glBufferData(GL_TEXTURE_BUFFER, sizeof(vec4) * 4, NULL, GL_STATIC_DRAW);

		glBindTexture(GL_TEXTURE_BUFFER, m_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_buffer);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_counter_buffer);
		vec4 zero(0);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(GLuint), &zero, GL_STATIC_DRAW);

		glBindBuffer(GL_UNIFORM_BUFFER, m_transform_buffer);
		mat4 identity(1);
		glBufferData(GL_UNIFORM_BUFFER, sizeof(mat4), &identity, GL_STATIC_DRAW);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer);
		glBindBufferBase(GL_UNIFORM_BUFFER, 0, m_transform_buffer);
		glBindImageTexture(0, m_buffer_tex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindVertexArray(m_vao);
		glBindProgramPipeline(m_pipeline);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLE_STRIP, 0, 4, 1, 0);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}

		std::vector<vec4> data(4);
		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glGetBufferSubData(GL_TEXTURE_BUFFER, 0, sizeof(vec4) * 4, &data[0]);

		for (int i = 0; i < 4; ++i)
		{
			if (!IsEqual(data[i], vec4(-1.0f, -1.0f, 0.0f, 1.0f)) && !IsEqual(data[i], vec4(1.0f, -1.0f, 0.0f, 1.0f)) &&
				!IsEqual(data[i], vec4(-1.0f, 1.0f, 0.0f, 1.0f)) && !IsEqual(data[i], vec4(1.0f, 1.0f, 0.0f, 1.0f)))
			{
				return ERROR;
			}
		}

		return NO_ERROR;
	}